

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

string * __thiscall
smf::MidiFile::base64Decode(string *__return_storage_ptr__,MidiFile *this,string *input)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  int iVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (input->_M_dataplus)._M_p;
  sVar2 = input->_M_string_length;
  iVar6 = -8;
  for (sVar5 = 0; (sVar2 != sVar5 && (uVar4 = (ulong)(byte)pcVar1[sVar5], uVar4 != 0x3d));
      sVar5 = sVar5 + 1) {
    iVar3 = iVar6;
    if ((*(int *)(decodeLookup + uVar4 * 4) != -1) && (iVar3 = iVar6 + 6, -7 < iVar6)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      iVar3 = iVar6 + -2;
    }
    iVar6 = iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::base64Decode(const std::string& input) {
	// vector<int> decodeLookup(256,-1);
	// for (int i=0; i<64; i++) decodeLookup[encodeLookup[i]] = i;

	std::string output;
	int vala = 0;
	int valb = -8;
	for (uchar c : input) {
		if (c == '=') {
			break;
		} else if (MidiFile::decodeLookup[c] == -1) {
         // Ignore whitespace, for example.
			continue;
		}
		vala = (vala << 6) + MidiFile::decodeLookup[c];
		valb += 6;
		if (valb >= 0) {
			output.push_back(char((vala >> valb) & 0xFF));
			valb -= 8;
		}
	}
	return output;
}